

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# makelevelset3.cpp
# Opt level: O0

float point_triangle_distance(Vec3f *x0,Vec3f *x1,Vec3f *x2,Vec3f *x3)

{
  Vec<3U,_float> *this;
  float fVar1;
  undefined1 auVar2 [16];
  float *pfVar3;
  Vec<3U,_float> *in_RDI;
  float fVar4;
  float fVar5;
  undefined1 in_ZMM0 [64];
  undefined1 auVar14 [56];
  undefined1 auVar6 [64];
  undefined1 auVar7 [64];
  undefined1 auVar8 [64];
  undefined1 auVar9 [64];
  undefined1 auVar10 [64];
  undefined1 auVar11 [64];
  undefined1 auVar12 [64];
  undefined1 auVar13 [64];
  Vec<3U,_float> VVar15;
  float w12;
  float w31;
  float w23;
  float b;
  float a;
  float invdet;
  float d;
  float m23;
  float m13;
  Vec3f x03;
  Vec3f x23;
  Vec3f x13;
  Vec<3U,_float> *in_stack_fffffffffffffe88;
  Vec<3U,_float> *in_stack_fffffffffffffe90;
  float local_168;
  float local_164;
  float local_160;
  float local_15c;
  float local_158;
  float local_154;
  undefined8 local_150;
  undefined4 in_stack_fffffffffffffeb8;
  undefined4 in_stack_fffffffffffffebc;
  Vec<3U,_float> *in_stack_fffffffffffffec0;
  Vec3f *in_stack_ffffffffffffff30;
  undefined4 in_stack_ffffffffffffff38;
  undefined4 in_stack_ffffffffffffff3c;
  Vec3f *in_stack_ffffffffffffff40;
  float local_a0;
  float local_9c;
  float local_98;
  float local_94;
  float local_90;
  float local_8c;
  float local_88 [2];
  float local_80;
  Vec<3U,_float> local_74;
  float local_68 [2];
  float local_60;
  Vec<3U,_float> local_58;
  float local_48 [2];
  float local_40;
  Vec<3U,_float> local_38 [3];
  Vec<3U,_float> *local_10;
  float local_4;
  
  auVar14 = in_ZMM0._8_56_;
  local_10 = in_RDI;
  VVar15 = Vec<3U,_float>::operator-
                     (in_stack_fffffffffffffec0,
                      (Vec<3U,_float> *)
                      CONCAT44(in_stack_fffffffffffffebc,in_stack_fffffffffffffeb8));
  local_40 = VVar15.v[2];
  auVar6._0_8_ = VVar15.v._0_8_;
  auVar6._8_56_ = auVar14;
  local_48 = (float  [2])vmovlpd_avx(auVar6._0_16_);
  local_38[0].v._0_8_ = local_48;
  local_38[0].v[2] = local_40;
  VVar15 = Vec<3U,_float>::operator-
                     (in_stack_fffffffffffffec0,
                      (Vec<3U,_float> *)
                      CONCAT44(in_stack_fffffffffffffebc,in_stack_fffffffffffffeb8));
  local_60 = VVar15.v[2];
  auVar7._0_8_ = VVar15.v._0_8_;
  auVar7._8_56_ = auVar14;
  local_68 = (float  [2])vmovlpd_avx(auVar7._0_16_);
  local_58.v._0_8_ = local_68;
  local_58.v[2] = local_60;
  VVar15 = Vec<3U,_float>::operator-
                     (in_stack_fffffffffffffec0,
                      (Vec<3U,_float> *)
                      CONCAT44(in_stack_fffffffffffffebc,in_stack_fffffffffffffeb8));
  local_80 = VVar15.v[2];
  auVar8._0_8_ = VVar15.v._0_8_;
  auVar8._8_56_ = auVar14;
  local_88 = (float  [2])vmovlpd_avx(auVar8._0_16_);
  local_74.v._0_8_ = local_88;
  local_74.v[2] = local_80;
  local_8c = mag2<3u,float>(in_stack_fffffffffffffe90);
  local_90 = mag2<3u,float>(in_stack_fffffffffffffe90);
  local_94 = dot<3u,float>(local_38,&local_58);
  auVar2 = vfmadd213ss_fma(ZEXT416((uint)local_90),ZEXT416((uint)local_8c),
                           ZEXT416((uint)-(local_94 * local_94)));
  local_9c = auVar2._0_4_;
  local_a0 = 1e-30;
  pfVar3 = std::max<float>(&local_9c,&local_a0);
  local_98 = 1.0 / *pfVar3;
  fVar4 = dot<3u,float>(local_38,&local_74);
  fVar5 = dot<3u,float>(&local_58,&local_74);
  auVar2 = vfmadd213ss_fma(ZEXT416((uint)fVar4),ZEXT416((uint)local_90),
                           ZEXT416((uint)-(local_94 * fVar5)));
  fVar1 = local_98 * auVar2._0_4_;
  auVar2 = vfmadd213ss_fma(ZEXT416((uint)fVar5),ZEXT416((uint)local_8c),
                           ZEXT416((uint)-(local_94 * fVar4)));
  fVar4 = local_98 * auVar2._0_4_;
  if (((fVar1 < 0.0) || (fVar4 < 0.0)) || ((1.0 - fVar1) - fVar4 < 0.0)) {
    if (fVar1 <= 0.0) {
      if (fVar4 <= 0.0) {
        local_164 = point_segment_distance
                              (in_stack_ffffffffffffff40,
                               (Vec3f *)CONCAT44(in_stack_ffffffffffffff3c,in_stack_ffffffffffffff38
                                                ),in_stack_ffffffffffffff30);
        local_168 = point_segment_distance
                              (in_stack_ffffffffffffff40,
                               (Vec3f *)CONCAT44(in_stack_ffffffffffffff3c,in_stack_ffffffffffffff38
                                                ),in_stack_ffffffffffffff30);
        pfVar3 = std::min<float>(&local_164,&local_168);
        local_4 = *pfVar3;
      }
      else {
        local_15c = point_segment_distance
                              (in_stack_ffffffffffffff40,
                               (Vec3f *)CONCAT44(in_stack_ffffffffffffff3c,in_stack_ffffffffffffff38
                                                ),in_stack_ffffffffffffff30);
        local_160 = point_segment_distance
                              (in_stack_ffffffffffffff40,
                               (Vec3f *)CONCAT44(in_stack_ffffffffffffff3c,in_stack_ffffffffffffff38
                                                ),in_stack_ffffffffffffff30);
        pfVar3 = std::min<float>(&local_15c,&local_160);
        local_4 = *pfVar3;
      }
    }
    else {
      local_154 = point_segment_distance
                            (in_stack_ffffffffffffff40,
                             (Vec3f *)CONCAT44(in_stack_ffffffffffffff3c,in_stack_ffffffffffffff38),
                             in_stack_ffffffffffffff30);
      local_158 = point_segment_distance
                            (in_stack_ffffffffffffff40,
                             (Vec3f *)CONCAT44(in_stack_ffffffffffffff3c,in_stack_ffffffffffffff38),
                             in_stack_ffffffffffffff30);
      pfVar3 = std::min<float>(&local_154,&local_158);
      local_4 = *pfVar3;
    }
  }
  else {
    auVar14 = (undefined1  [56])0x0;
    VVar15 = operator*((float)((ulong)in_stack_fffffffffffffec0 >> 0x20),
                       (Vec<3U,_float> *)
                       CONCAT44(in_stack_fffffffffffffebc,in_stack_fffffffffffffeb8));
    auVar9._0_8_ = VVar15.v._0_8_;
    auVar9._8_56_ = auVar14;
    vmovlpd_avx(auVar9._0_16_);
    auVar14 = (undefined1  [56])0x0;
    VVar15 = operator*((float)((ulong)in_stack_fffffffffffffec0 >> 0x20),
                       (Vec<3U,_float> *)
                       CONCAT44(in_stack_fffffffffffffebc,in_stack_fffffffffffffeb8));
    auVar10._0_8_ = VVar15.v._0_8_;
    auVar10._8_56_ = auVar14;
    vmovlpd_avx(auVar10._0_16_);
    VVar15 = Vec<3U,_float>::operator+
                       (in_stack_fffffffffffffec0,
                        (Vec<3U,_float> *)
                        CONCAT44(in_stack_fffffffffffffebc,in_stack_fffffffffffffeb8));
    auVar11._0_8_ = VVar15.v._0_8_;
    auVar11._8_56_ = auVar14;
    vmovlpd_avx(auVar11._0_16_);
    auVar14 = (undefined1  [56])0x0;
    VVar15 = operator*((float)((ulong)in_stack_fffffffffffffec0 >> 0x20),
                       (Vec<3U,_float> *)
                       CONCAT44(in_stack_fffffffffffffebc,in_stack_fffffffffffffeb8));
    auVar12._0_8_ = VVar15.v._0_8_;
    auVar12._8_56_ = auVar14;
    this = (Vec<3U,_float> *)vmovlpd_avx(auVar12._0_16_);
    VVar15 = Vec<3U,_float>::operator+
                       (this,(Vec<3U,_float> *)
                             CONCAT44(in_stack_fffffffffffffebc,in_stack_fffffffffffffeb8));
    auVar13._0_8_ = VVar15.v._0_8_;
    auVar13._8_56_ = auVar14;
    local_150 = vmovlpd_avx(auVar13._0_16_);
    local_4 = dist<3u,float>(local_10,in_stack_fffffffffffffe88);
  }
  return local_4;
}

Assistant:

static float point_triangle_distance(const Vec3f &x0, const Vec3f &x1, const Vec3f &x2,
                                     const Vec3f &x3) {
  // first find barycentric coordinates of closest point on infinite plane
  Vec3f x13(x1 - x3), x23(x2 - x3), x03(x0 - x3);
  float m13 = mag2(x13), m23 = mag2(x23), d = dot(x13, x23);
  float invdet = 1.f / max(m13 * m23 - d * d, 1e-30f);
  float a = dot(x13, x03), b = dot(x23, x03);
  // the barycentric coordinates themselves
  float w23 = invdet * (m23 * a - d * b);
  float w31 = invdet * (m13 * b - d * a);
  float w12 = 1 - w23 - w31;
  if (w23 >= 0 && w31 >= 0 && w12 >= 0) {  // if we're inside the triangle
    return dist(x0, w23 * x1 + w31 * x2 + w12 * x3);
  } else {        // we have to clamp to one of the edges
    if (w23 > 0)  // this rules out edge 2-3 for us
      return min(point_segment_distance(x0, x1, x2), point_segment_distance(x0, x1, x3));
    else if (w31 > 0)  // this rules out edge 1-3
      return min(point_segment_distance(x0, x1, x2), point_segment_distance(x0, x2, x3));
    else  // w12 must be >0, ruling out edge 1-2
      return min(point_segment_distance(x0, x1, x3), point_segment_distance(x0, x2, x3));
  }
}